

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

void TT_Get_VMetrics(TT_Face face,FT_UInt idx,FT_Pos yMax,FT_Short *tsb,FT_UShort *ah)

{
  FT_UShort FVar1;
  FT_UShort *ah_local;
  FT_Short *tsb_local;
  FT_Pos yMax_local;
  FT_UInt idx_local;
  TT_Face face_local;
  
  if (face->vertical_info == '\0') {
    if ((face->os2).version == 0xffff) {
      *tsb = (face->horizontal).Ascender - (short)yMax;
      if ((int)(face->horizontal).Ascender - (int)(face->horizontal).Descender < 0) {
        FVar1 = -((face->horizontal).Ascender - (face->horizontal).Descender);
      }
      else {
        FVar1 = (face->horizontal).Ascender - (face->horizontal).Descender;
      }
      *ah = FVar1;
    }
    else {
      *tsb = (face->os2).sTypoAscender - (short)yMax;
      if ((int)(face->os2).sTypoAscender - (int)(face->os2).sTypoDescender < 0) {
        FVar1 = -((face->os2).sTypoAscender - (face->os2).sTypoDescender);
      }
      else {
        FVar1 = (face->os2).sTypoAscender - (face->os2).sTypoDescender;
      }
      *ah = FVar1;
    }
  }
  else {
    (**(code **)((long)face->sfnt + 0xe0))(face,1,idx,tsb,ah);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  TT_Get_VMetrics( TT_Face     face,
                   FT_UInt     idx,
                   FT_Pos      yMax,
                   FT_Short*   tsb,
                   FT_UShort*  ah )
  {
    if ( face->vertical_info )
      ( (SFNT_Service)face->sfnt )->get_metrics( face, 1, idx, tsb, ah );

    else if ( face->os2.version != 0xFFFFU )
    {
      *tsb = (FT_Short)( face->os2.sTypoAscender - yMax );
      *ah  = (FT_UShort)FT_ABS( face->os2.sTypoAscender -
                                face->os2.sTypoDescender );
    }

    else
    {
      *tsb = (FT_Short)( face->horizontal.Ascender - yMax );
      *ah  = (FT_UShort)FT_ABS( face->horizontal.Ascender -
                                face->horizontal.Descender );
    }

    FT_TRACE5(( "  advance height (font units): %d\n", *ah ));
    FT_TRACE5(( "  top side bearing (font units): %d\n", *tsb ));
  }